

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_1.cpp
# Opt level: O3

void file_to_lower(string *in_filename,string *out_filename)

{
  char cVar1;
  long *plVar2;
  istream *piVar3;
  ostream *poVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ulong *puVar6;
  string line;
  ofstream out_file;
  ifstream in_file;
  char local_479;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  undefined1 local_438 [8];
  size_type local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  byte abStack_418 [216];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream((istream *)local_238,(string *)in_filename,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::operator+(&local_478,"Could not open file \'",in_filename);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_478);
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 == paVar5) {
      local_428._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_428._8_8_ = plVar2[3];
      local_438 = (undefined1  [8])&local_428;
    }
    else {
      local_428._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_438 = (undefined1  [8])*plVar2;
    }
    local_430 = plVar2[1];
    *plVar2 = (long)paVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    error((string *)local_438);
    if (local_438 != (undefined1  [8])&local_428) {
      operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
  }
  std::ofstream::ofstream(local_438,(string *)out_filename,_S_out);
  if ((abStack_418[*(long *)((long)local_438 + -0x18)] & 5) != 0) {
    std::operator+(&local_458,"Could not open file \'",in_filename);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_458);
    puVar6 = (ulong *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_478.field_2._M_allocated_capacity = *puVar6;
      local_478.field_2._8_8_ = plVar2[3];
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    }
    else {
      local_478.field_2._M_allocated_capacity = *puVar6;
      local_478._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_478._M_string_length = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    error(&local_478);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
  }
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  local_478._M_string_length = 0;
  local_478.field_2._M_allocated_capacity =
       local_478.field_2._M_allocated_capacity & 0xffffffffffffff00;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_478,cVar1);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    to_lower(&local_458,&local_478);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_438,local_458._M_dataplus._M_p,local_458._M_string_length);
    local_479 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_479,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  local_438 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_438 + *(long *)(_VTT + -0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)&local_430);
  std::ios_base::~ios_base(local_340);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void file_to_lower(const std::string& in_filename, const std::string& out_filename)
{
	std::ifstream in_file{ in_filename };
	if (!in_file)
	{
		error("Could not open file '" + in_filename + "' for reading.");
	}
	std::ofstream out_file{ out_filename };
	if (!out_file)
	{
		error("Could not open file '" + in_filename + "' for reading.");
	}
	std::string line;
	while (std::getline(in_file, line))
	{
		out_file << to_lower(line) << '\n';
	}
}